

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O0

void __thiscall
TasGrid::GridGlobal::estimateAnisotropicCoefficients
          (GridGlobal *this,TypeDepth type,int output,vector<int,_std::allocator<int>_> *weights)

{
  vector<int,_std::allocator<int>_> local_58;
  undefined1 local_40 [8];
  vector<double,_std::allocator<double>_> surp;
  double tol;
  vector<int,_std::allocator<int>_> *weights_local;
  int output_local;
  TypeDepth type_local;
  GridGlobal *this_local;
  
  surp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3e112e0be826d695;
  computeSurpluses((vector<double,_std::allocator<double>_> *)local_40,this,output,false);
  MultiIndexManipulations::inferAnisotropicWeights
            (&local_58,(this->super_BaseCanonicalGrid).acceleration,this->rule,type,
             &(this->super_BaseCanonicalGrid).points,
             (vector<double,_std::allocator<double>_> *)local_40,
             (double)surp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  ::std::vector<int,_std::allocator<int>_>::operator=
            (weights,(vector<int,_std::allocator<int>_> *)&local_58);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&local_58);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  return;
}

Assistant:

void GridGlobal::estimateAnisotropicCoefficients(TypeDepth type, int output, std::vector<int> &weights) const{
    double tol = 1000.0 * Maths::num_tol;
    std::vector<double> surp = computeSurpluses(output, false);

    weights = MultiIndexManipulations::inferAnisotropicWeights(acceleration, rule, type, points, surp, tol);
}